

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::ChromeCompositorSchedulerState::ParseFromArray
          (ChromeCompositorSchedulerState *this,void *raw,size_t size)

{
  uint64_t uVar1;
  undefined1 uVar2;
  uint uVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  uint64_t *puVar6;
  uint64_t uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t *end;
  ulong uVar10;
  uint64_t preamble;
  uint32_t local_60;
  ushort local_5c;
  uint8_t local_5a;
  uint64_t int_value;
  uint64_t payload_length;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  bitset<18UL> *local_40;
  uint64_t payload_length_1;
  
  local_48 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  end = (uint64_t *)(size + (long)raw);
  uVar9 = 0;
  do {
    if (end <= raw) goto switchD_002d5136_caseD_3;
    preamble = 0;
    if ((long)(char)*raw < 0) {
      puVar6 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&preamble);
      if (puVar6 != (uint64_t *)raw) goto LAB_002d50fe;
LAB_002d5551:
      uVar9 = 0;
      uVar7 = 0;
      goto LAB_002d5230;
    }
    puVar6 = (uint64_t *)((long)raw + 1);
    preamble = (long)(char)*raw;
LAB_002d50fe:
    uVar1 = preamble;
    uVar10 = preamble >> 3;
    uVar3 = (uint)uVar10;
    if ((uVar3 == 0) || (end <= puVar6)) goto LAB_002d5551;
    int_value = 0;
    switch((uint)preamble & 7) {
    case 0:
      puVar5 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar6,(uint8_t *)end,&int_value);
      uVar8 = 0;
      uVar7 = 0;
      if (puVar5 == puVar6) goto LAB_002d5230;
      break;
    case 1:
      puVar5 = puVar6 + 1;
      if (end < puVar5) goto switchD_002d5136_caseD_3;
      int_value = *puVar6;
LAB_002d5182:
      uVar8 = 0;
      break;
    case 2:
      puVar4 = (uint64_t *)
               protozero::proto_utils::ParseVarInt((uint8_t *)puVar6,(uint8_t *)end,&payload_length)
      ;
      if ((puVar4 == puVar6) || ((ulong)((long)end - (long)puVar4) < payload_length))
      goto switchD_002d5136_caseD_3;
      puVar5 = (uint64_t *)((long)puVar4 + payload_length);
      uVar8 = payload_length;
      int_value = (uint64_t)puVar4;
      break;
    default:
      goto switchD_002d5136_caseD_3;
    case 5:
      puVar5 = (uint64_t *)((long)puVar6 + 4);
      if (puVar5 <= end) {
        int_value = (uint64_t)(uint)*puVar6;
        goto LAB_002d5182;
      }
      goto switchD_002d5136_caseD_3;
    }
    raw = puVar5;
  } while ((0xffff < uVar3) || (0xfffffff < uVar8));
  uVar9 = uVar8 | (uVar1 & 7) << 0x30 | uVar10 << 0x20;
  uVar7 = int_value;
LAB_002d5230:
  local_40 = &this->_has_field_;
LAB_002d5248:
  do {
    preamble = uVar7;
    local_60 = (uint32_t)uVar9;
    local_5a = (uint8_t)(uVar9 >> 0x30);
    uVar3 = (uint)(uVar9 >> 0x20);
    local_5c = (ushort)(uVar9 >> 0x20);
    if (local_5c == 0) {
      return end == (uint64_t *)raw;
    }
    if (local_5c < 0x12) {
      std::bitset<18UL>::set(local_40,(ulong)(uVar3 & 0x1f),true);
      uVar3 = (uint)local_5c;
    }
    uVar3 = (uVar3 & 0xffff) - 1;
    if (uVar3 < 0x11) {
      uVar2 = (*(code *)(&DAT_0037a7e8 + *(int *)(&DAT_0037a7e8 + (ulong)uVar3 * 4)))();
      return (bool)uVar2;
    }
    protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
              ((Field *)&preamble,local_48);
    do {
      if (end <= raw) {
LAB_002d552e:
        uVar9 = 0;
        uVar7 = 0;
        goto LAB_002d5248;
      }
      int_value = 0;
      if ((long)(char)*raw < 0) {
        puVar6 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt((uint8_t *)raw,(uint8_t *)end,&int_value);
        if (puVar6 == (uint64_t *)raw) goto LAB_002d552e;
      }
      else {
        puVar6 = (uint64_t *)((long)raw + 1);
        int_value = (long)(char)*raw;
      }
      uVar1 = int_value;
      uVar10 = int_value >> 3;
      uVar3 = (uint)uVar10;
      if ((uVar3 == 0) || (end <= puVar6)) goto LAB_002d552e;
      payload_length = 0;
      switch((uint)int_value & 7) {
      case 0:
        puVar5 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar6,(uint8_t *)end,&payload_length);
        uVar8 = 0;
        uVar9 = 0;
        uVar7 = 0;
        if (puVar5 == puVar6) goto LAB_002d5248;
        break;
      case 1:
        puVar5 = puVar6 + 1;
        if (end < puVar5) goto switchD_002d53cd_caseD_3;
        payload_length = *puVar6;
LAB_002d5424:
        uVar8 = 0;
        break;
      case 2:
        puVar4 = (uint64_t *)
                 protozero::proto_utils::ParseVarInt
                           ((uint8_t *)puVar6,(uint8_t *)end,&payload_length_1);
        if ((puVar4 == puVar6) || ((ulong)((long)end - (long)puVar4) < payload_length_1))
        goto switchD_002d53cd_caseD_3;
        puVar5 = (uint64_t *)((long)puVar4 + payload_length_1);
        uVar8 = payload_length_1;
        payload_length = (uint64_t)puVar4;
        break;
      default:
        goto switchD_002d53cd_caseD_3;
      case 5:
        puVar5 = (uint64_t *)((long)puVar6 + 4);
        if (puVar5 <= end) {
          payload_length = (uint64_t)(uint)*puVar6;
          goto LAB_002d5424;
        }
        goto switchD_002d53cd_caseD_3;
      }
      raw = puVar5;
    } while ((0xffff < uVar3) || (0xfffffff < uVar8));
    uVar9 = uVar8 | (uVar1 & 7) << 0x30 | uVar10 << 0x20;
    uVar7 = payload_length;
  } while( true );
switchD_002d5136_caseD_3:
  uVar9 = 0;
  uVar7 = 0;
  goto LAB_002d5230;
switchD_002d53cd_caseD_3:
  uVar9 = 0;
  uVar7 = 0;
  goto LAB_002d5248;
}

Assistant:

bool ChromeCompositorSchedulerState::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* state_machine */:
        (*state_machine_).ParseFromArray(field.data(), field.size());
        break;
      case 2 /* observing_begin_frame_source */:
        field.get(&observing_begin_frame_source_);
        break;
      case 3 /* begin_impl_frame_deadline_task */:
        field.get(&begin_impl_frame_deadline_task_);
        break;
      case 4 /* pending_begin_frame_task */:
        field.get(&pending_begin_frame_task_);
        break;
      case 5 /* skipped_last_frame_missed_exceeded_deadline */:
        field.get(&skipped_last_frame_missed_exceeded_deadline_);
        break;
      case 7 /* inside_action */:
        field.get(&inside_action_);
        break;
      case 8 /* deadline_mode */:
        field.get(&deadline_mode_);
        break;
      case 9 /* deadline_us */:
        field.get(&deadline_us_);
        break;
      case 10 /* deadline_scheduled_at_us */:
        field.get(&deadline_scheduled_at_us_);
        break;
      case 11 /* now_us */:
        field.get(&now_us_);
        break;
      case 12 /* now_to_deadline_delta_us */:
        field.get(&now_to_deadline_delta_us_);
        break;
      case 13 /* now_to_deadline_scheduled_at_delta_us */:
        field.get(&now_to_deadline_scheduled_at_delta_us_);
        break;
      case 14 /* begin_impl_frame_args */:
        (*begin_impl_frame_args_).ParseFromArray(field.data(), field.size());
        break;
      case 15 /* begin_frame_observer_state */:
        (*begin_frame_observer_state_).ParseFromArray(field.data(), field.size());
        break;
      case 16 /* begin_frame_source_state */:
        (*begin_frame_source_state_).ParseFromArray(field.data(), field.size());
        break;
      case 17 /* compositor_timing_history */:
        (*compositor_timing_history_).ParseFromArray(field.data(), field.size());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}